

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeViewPrivate::prepareAnimatedOperation(QTreeViewPrivate *this,int item,Direction direction)

{
  AnimatedOperation *pAVar1;
  uint uVar2;
  QWidgetData *pQVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int item_00;
  long in_FS_OFFSET;
  undefined1 local_80 [40];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = &this->animatedOperation;
  (this->animatedOperation).item = item;
  (this->animatedOperation).viewport =
       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QAbstractAnimation::setDirection((Direction)pAVar1);
  iVar6 = coordinateForItem(this,item);
  iVar7 = itemHeight(this,item);
  iVar7 = iVar7 + iVar6;
  pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  local_80._32_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  iVar6 = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
  local_80._36_4_ = iVar6;
  local_80._24_4_ = 0;
  uVar5 = local_80._24_4_;
  local_80._24_4_ = 0;
  local_80._28_4_ = iVar7;
  if (direction == Backward) {
    uVar2 = *(uint *)&(this->viewItems).d.ptr[item].field_0x1c;
    iVar9 = 0;
    if ((0xf < uVar2) &&
       (iVar6 = (iVar6 - iVar7) * 2 + 2, iVar9 = 0, uVar5 = local_80._24_4_, 0 < iVar6)) {
      item_00 = item + 1;
      iVar9 = 0;
      do {
        iVar8 = itemHeight(this,item_00);
        iVar9 = iVar8 + iVar9;
        uVar5 = local_80._24_4_;
        if ((int)((uVar2 >> 4) + item) <= item_00) break;
        item_00 = item_00 + 1;
      } while (iVar9 < iVar6);
    }
    local_80._24_4_ = uVar5;
    local_80._36_4_ = local_80._28_4_ + iVar9 + -1;
    ::QVariant::QVariant(&local_58,iVar9 + iVar7);
    QVariantAnimation::setEndValue((QVariant *)pAVar1);
    ::QVariant::~QVariant(&local_58);
    uVar5 = local_80._24_4_;
  }
  local_80._24_4_ = uVar5;
  ::QVariant::QVariant(&local_58,iVar7);
  QVariantAnimation::setStartValue((QVariant *)pAVar1);
  ::QVariant::~QVariant(&local_58);
  renderTreeToPixmapForAnimation((QTreeViewPrivate *)local_80,(QRect *)this);
  local_58.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
  uVar4 = local_80._16_8_;
  local_58.d.data.shared = (PrivateShared *)QDataStream::operator<<;
  local_80._16_8_ = 0;
  local_58.d.data._16_8_ = *(undefined8 *)&(this->animatedOperation).field_0x28;
  *(undefined8 *)&(this->animatedOperation).field_0x28 = uVar4;
  QPixmap::~QPixmap((QPixmap *)&local_58);
  QPixmap::~QPixmap((QPixmap *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::prepareAnimatedOperation(int item, QVariantAnimation::Direction direction)
{
    animatedOperation.item = item;
    animatedOperation.viewport = viewport;
    animatedOperation.setDirection(direction);

    int top = coordinateForItem(item) + itemHeight(item);
    QRect rect = viewport->rect();
    rect.setTop(top);
    if (direction == QVariantAnimation::Backward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = item + viewItems.at(item).total + 1;
        for (int i = item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(top + h);
    }
    animatedOperation.setStartValue(top);
    animatedOperation.before = renderTreeToPixmapForAnimation(rect);
}